

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintCCapability::PrintCCapability(PrintCCapability *this)

{
  PrintCCapability *this_local;
  
  PrintLanguageCapability::PrintLanguageCapability(&this->super_PrintLanguageCapability);
  (this->super_PrintLanguageCapability).super_CapabilityPoint._vptr_CapabilityPoint =
       (_func_int **)&PTR__PrintCCapability_00856188;
  std::__cxx11::string::operator=
            ((string *)&(this->super_PrintLanguageCapability).name,"c-language");
  (this->super_PrintLanguageCapability).isdefault = true;
  return;
}

Assistant:

PrintCCapability::PrintCCapability(void)

{
  name = "c-language";
  isdefault = true;
}